

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_builder.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::GenerateBuildPartial
          (MessageBuilderGenerator *this,Printer *printer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *buffer;
  OneofDescriptor *oneof;
  bool bVar1;
  bool bVar2;
  int iVar3;
  Nonnull<char_*> pcVar4;
  ImmutableFieldGenerator *pIVar5;
  reference ppVar6;
  OneofGeneratorInfo *args_1;
  Descriptor *pDVar7;
  Nonnull<const_char_*> pcVar8;
  undefined8 extraout_RAX;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  uint uVar12;
  java *this_00;
  string *this_01;
  uint uVar13;
  long lVar14;
  long lVar15;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  const_iterator other;
  string_view text_08;
  iterator iVar16;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  ulong local_38;
  
  ClassNameResolver::GetClassName_abi_cxx11_(&local_a8,this->name_resolver_,this->descriptor_,true);
  text._M_str = 
  "@java.lang.Override\npublic $classname$ buildPartial() {\n  $classname$ result = new $classname$(this);\n"
  ;
  text._M_len = 0x66;
  io::Printer::Print<char[10],std::__cxx11::string>(printer,text,(char (*) [10])0x5620ff,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  iVar3 = this->descriptor_->field_count_;
  bVar2 = 0 < iVar3;
  if (0 < iVar3) {
    bVar1 = anon_unknown_16::BitfieldTracksMutability(this->descriptor_->fields_);
    if (!bVar1) {
      lVar14 = 0;
      lVar15 = 0x58;
      do {
        lVar14 = lVar14 + 1;
        lVar10 = (long)this->descriptor_->field_count_;
        bVar2 = lVar14 < lVar10;
        if (lVar10 <= lVar14) goto LAB_002af569;
        bVar1 = anon_unknown_16::BitfieldTracksMutability
                          ((FieldDescriptor *)
                           (&this->descriptor_->fields_->super_SymbolBase + lVar15));
        lVar15 = lVar15 + 0x58;
      } while (!bVar1);
    }
    text_00._M_str = "buildPartialRepeatedFields(result);\n";
    text_00._M_len = 0x24;
    io::Printer::Print<>(printer,text_00);
  }
LAB_002af569:
  uVar13 = this->descriptor_->field_count_;
  uVar11 = (ulong)uVar13;
  iVar3 = uVar13 + 0x3e;
  if (-1 < (int)(uVar13 + 0x1f)) {
    iVar3 = uVar13 + 0x1f;
  }
  uVar9 = iVar3 >> 5;
  local_38 = uVar11;
  if (0 < (int)uVar13) {
    uVar13 = 1;
    if (1 < (int)uVar9) {
      uVar13 = uVar9;
    }
    this_00 = (java *)0x0;
    do {
      GetBitFieldName_abi_cxx11_(&local_58,this_00,(int)uVar11);
      buffer = &local_a8.field_2;
      pcVar4 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                         ((int)this_00,buffer->_M_local_buf);
      local_a8._M_dataplus._M_p = pcVar4 + -(long)buffer;
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      local_a8._M_string_length = (size_type)buffer;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,buffer,pcVar4);
      text_01._M_str = "if ($bit_field_name$ != 0) { buildPartial$piece$(result); }\n";
      text_01._M_len = 0x3c;
      io::Printer::Print<char[15],std::__cxx11::string,char[6],std::__cxx11::string>
                (printer,text_01,(char (*) [15])"bit_field_name",&local_58,(char (*) [6])"piece",
                 &local_78);
      uVar11 = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        uVar11 = extraout_RDX_00;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        uVar11 = extraout_RDX_01;
      }
      uVar12 = (int)this_00 + 1;
      this_00 = (java *)(ulong)uVar12;
    } while (uVar13 != uVar12);
  }
  if ((this->oneofs_).
      super_btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
      .
      super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
      .
      super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
      .tree_.size_ != 0) {
    text_02._M_str = "buildPartialOneofs(result);\n";
    text_02._M_len = 0x1c;
    io::Printer::Print<>(printer,text_02);
  }
  io::Printer::Outdent(printer);
  ClassNameResolver::GetClassName_abi_cxx11_(&local_a8,this->name_resolver_,this->descriptor_,true);
  text_03._M_str = "  onBuilt();\n  return result;\n}\n\n";
  text_03._M_len = 0x21;
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,text_03,(char (*) [10])0x5620ff,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    ClassNameResolver::GetClassName_abi_cxx11_
              (&local_a8,this->name_resolver_,this->descriptor_,true);
    text_04._M_str = "private void buildPartialRepeatedFields($classname$ result) {\n";
    text_04._M_len = 0x3e;
    io::Printer::Print<char[10],std::__cxx11::string>
              (printer,text_04,(char (*) [10])0x5620ff,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
    pDVar7 = this->descriptor_;
    if (0 < pDVar7->field_count_) {
      lVar15 = 0;
      this_01 = (string *)0x0;
      do {
        bVar2 = anon_unknown_16::BitfieldTracksMutability
                          ((FieldDescriptor *)(&pDVar7->fields_->super_SymbolBase + lVar15));
        if (bVar2) {
          pDVar7 = this->descriptor_;
          lVar14 = (long)pDVar7->field_count_;
          if ((long)this_01 < lVar14) {
            pcVar8 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                               ((long)this_01,lVar14,"index < field_count()");
          }
          if (pcVar8 != (Nonnull<const_char_*>)0x0) {
LAB_002af9f3:
            GenerateBuildPartial();
            if ((string *)local_a8._M_dataplus._M_p != this_01) {
              operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            }
            _Unwind_Resume(extraout_RAX);
          }
          pIVar5 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                             (&this->field_generators_,
                              (FieldDescriptor *)(&pDVar7->fields_->super_SymbolBase + lVar15));
          (*(pIVar5->super_FieldGenerator)._vptr_FieldGenerator[0xd])(pIVar5,printer);
        }
        this_01 = (string *)((long)&(this_01->_M_dataplus)._M_p + 1);
        pDVar7 = this->descriptor_;
        lVar15 = lVar15 + 0x58;
      } while ((long)this_01 < (long)pDVar7->field_count_);
    }
    io::Printer::Outdent(printer);
    text_05._M_str = "}\n\n";
    text_05._M_len = 3;
    io::Printer::Print<>(printer,text_05);
  }
  if (0 < (int)local_38) {
    uVar13 = 1;
    if (1 < (int)uVar9) {
      uVar13 = uVar9;
    }
    iVar3 = 0;
    uVar9 = 0;
    do {
      iVar3 = GenerateBuildPartialPiece(this,printer,uVar9,iVar3);
      uVar9 = uVar9 + 1;
    } while (uVar13 != uVar9);
  }
  if ((this->oneofs_).
      super_btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
      .
      super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
      .
      super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
      .tree_.size_ != 0) {
    ClassNameResolver::GetClassName_abi_cxx11_
              (&local_a8,this->name_resolver_,this->descriptor_,true);
    text_06._M_str = "private void buildPartialOneofs($classname$ result) {\n";
    text_06._M_len = 0x36;
    io::Printer::Print<char[10],std::__cxx11::string>
              (printer,text_06,(char (*) [10])0x5620ff,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
    iVar16 = absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
             ::begin((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                      *)&this->oneofs_);
    local_58._M_dataplus._M_p = (pointer)iVar16.node_;
    local_58._M_string_length._0_4_ = iVar16.position_;
    iVar16 = absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
             ::end((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                    *)&this->oneofs_);
    bVar2 = absl::lts_20250127::container_internal::
            btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
            ::Equals((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                      *)&local_58,(const_iterator)iVar16);
    if (!bVar2) {
      this_01 = &local_58;
      do {
        ppVar6 = absl::lts_20250127::container_internal::
                 btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                 ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                              *)this_01);
        oneof = ppVar6->second;
        args_1 = Context::GetOneofGeneratorInfo(this->context_,oneof);
        text_07._M_str =
             "result.$oneof_name$Case_ = $oneof_name$Case_;\nresult.$oneof_name$_ = this.$oneof_name$_;\n"
        ;
        text_07._M_len = 0x59;
        io::Printer::Print<char[11],std::__cxx11::string>
                  (printer,text_07,(char (*) [11])0x5c90c8,&args_1->name);
        if (0 < oneof->field_count_) {
          lVar14 = 0;
          lVar15 = 0;
          do {
            pDVar7 = FieldDescriptor::message_type
                               ((FieldDescriptor *)(&oneof->fields_->super_SymbolBase + lVar14));
            if (pDVar7 != (Descriptor *)0x0) {
              if (lVar15 < oneof->field_count_) {
                pcVar8 = (Nonnull<const_char_*>)0x0;
              }
              else {
                pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                   (lVar15,(long)oneof->field_count_,"index < field_count()");
              }
              if (pcVar8 != (Nonnull<const_char_*>)0x0) {
                GenerateBuildPartial();
                goto LAB_002af9f3;
              }
              pIVar5 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>
                       ::get(&this->field_generators_,
                             (FieldDescriptor *)(&oneof->fields_->super_SymbolBase + lVar14));
              (*(pIVar5->super_FieldGenerator)._vptr_FieldGenerator[0xd])(pIVar5,printer);
            }
            lVar15 = lVar15 + 1;
            lVar14 = lVar14 + 0x58;
          } while (lVar15 < oneof->field_count_);
        }
        absl::lts_20250127::container_internal::
        btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
        ::increment((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                     *)this_01);
        other._12_4_ = 0;
        other.node_ = (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                       *)SUB128(iVar16._0_12_,0);
        other.position_ = SUB124(iVar16._0_12_,8);
        bVar2 = absl::lts_20250127::container_internal::
                btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                ::Equals((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                          *)this_01,other);
      } while (!bVar2);
    }
    io::Printer::Outdent(printer);
    text_08._M_str = "}\n\n";
    text_08._M_len = 3;
    io::Printer::Print<>(printer,text_08);
  }
  return;
}

Assistant:

void MessageBuilderGenerator::GenerateBuildPartial(io::Printer* printer) {
  printer->Print(
      "@java.lang.Override\n"
      "public $classname$ buildPartial() {\n"
      "  $classname$ result = new $classname$(this);\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Indent();

  // Handle the repeated fields first so that the "mutable bits" are cleared.
  bool has_repeated_fields = false;
  for (int i = 0; i < descriptor_->field_count(); ++i) {
    if (BitfieldTracksMutability(descriptor_->field(i))) {
      has_repeated_fields = true;
      printer->Print("buildPartialRepeatedFields(result);\n");
      break;
    }
  }

  // One buildPartial#() per from_bit_field
  int totalBuilderInts = (descriptor_->field_count() + 31) / 32;
  if (totalBuilderInts > 0) {
    for (int i = 0; i < totalBuilderInts; ++i) {
      printer->Print(
          "if ($bit_field_name$ != 0) { buildPartial$piece$(result); }\n",
          "bit_field_name", GetBitFieldName(i), "piece", absl::StrCat(i));
    }
  }

  if (!oneofs_.empty()) {
    printer->Print("buildPartialOneofs(result);\n");
  }

  printer->Outdent();
  printer->Print(
      "  onBuilt();\n"
      "  return result;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // Build Repeated Fields
  if (has_repeated_fields) {
    printer->Print(
        "private void buildPartialRepeatedFields($classname$ result) {\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_));
    printer->Indent();
    for (int i = 0; i < descriptor_->field_count(); ++i) {
      if (BitfieldTracksMutability(descriptor_->field(i))) {
        const ImmutableFieldGenerator& field =
            field_generators_.get(descriptor_->field(i));
        field.GenerateBuildingCode(printer);
      }
    }
    printer->Outdent();
    printer->Print("}\n\n");
  }

  // Build non-oneof fields
  int start_field = 0;
  for (int i = 0; i < totalBuilderInts; i++) {
    start_field = GenerateBuildPartialPiece(printer, i, start_field);
  }

  // Build Oneofs
  if (!oneofs_.empty()) {
    printer->Print("private void buildPartialOneofs($classname$ result) {\n",
                   "classname",
                   name_resolver_->GetImmutableClassName(descriptor_));
    printer->Indent();
    for (auto& kv : oneofs_) {
      const OneofDescriptor* oneof = kv.second;
      printer->Print(
          "result.$oneof_name$Case_ = $oneof_name$Case_;\n"
          "result.$oneof_name$_ = this.$oneof_name$_;\n",
          "oneof_name", context_->GetOneofGeneratorInfo(oneof)->name);
      for (int i = 0; i < oneof->field_count(); ++i) {
        if (oneof->field(i)->message_type() != nullptr) {
          const ImmutableFieldGenerator& field =
              field_generators_.get(oneof->field(i));
          field.GenerateBuildingCode(printer);
        }
      }
    }
    printer->Outdent();
    printer->Print("}\n\n");
  }
}